

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.c
# Opt level: O3

bool_t prf_header_save_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  uint8_t *buffer;
  uint uVar1;
  uint uVar2;
  bool_t bVar3;
  
  if (node->opcode == prf_header_info.opcode) {
    bf_put_uint16_be(bfile,node->opcode);
    bf_put_uint16_be(bfile,node->length);
    uVar1 = (uint)node->length;
    uVar2 = 4;
    if (0xb < node->length) {
      buffer = node->data;
      bf_write(bfile,buffer,8);
      uVar1 = (uint)node->length;
      uVar2 = 0xc;
      if (0xf < node->length) {
        bf_put_int32_be(bfile,*(int32_t *)(buffer + 8));
        uVar1 = (uint)node->length;
        uVar2 = 0x10;
        if (0x13 < node->length) {
          bf_put_int32_be(bfile,*(int32_t *)(buffer + 0xc));
          uVar1 = (uint)node->length;
          uVar2 = 0x14;
          if (0x33 < node->length) {
            bf_write(bfile,buffer + 0x10,0x20);
            uVar1 = (uint)node->length;
            uVar2 = 0x34;
            if (0x35 < node->length) {
              bf_put_int16_be(bfile,*(int16_t *)(buffer + 0x30));
              uVar1 = (uint)node->length;
              uVar2 = 0x36;
              if (0x37 < node->length) {
                bf_put_int16_be(bfile,*(int16_t *)(buffer + 0x32));
                uVar1 = (uint)node->length;
                uVar2 = 0x38;
                if (0x39 < node->length) {
                  bf_put_int16_be(bfile,*(int16_t *)(buffer + 0x34));
                  uVar1 = (uint)node->length;
                  uVar2 = 0x3a;
                  if (0x3b < node->length) {
                    bf_put_int16_be(bfile,*(int16_t *)(buffer + 0x36));
                    uVar1 = (uint)node->length;
                    uVar2 = 0x3c;
                    if (0x3d < node->length) {
                      bf_put_int16_be(bfile,*(int16_t *)(buffer + 0x38));
                      uVar1 = (uint)node->length;
                      uVar2 = 0x3e;
                      if (0x3e < node->length) {
                        bf_put_int8(bfile,buffer[0x3a]);
                        uVar1 = (uint)node->length;
                        uVar2 = 0x3f;
                        if (0x3f < node->length) {
                          bf_put_int8(bfile,buffer[0x3b]);
                          uVar1 = (uint)node->length;
                          uVar2 = 0x40;
                          if (0x43 < node->length) {
                            bf_put_uint32_be(bfile,*(uint32_t *)(buffer + 0x3c));
                            uVar1 = (uint)node->length;
                            uVar2 = 0x44;
                            if (0x47 < node->length) {
                              bf_put_int32_be(bfile,*(int32_t *)(buffer + 0x40));
                              uVar1 = (uint)node->length;
                              uVar2 = 0x48;
                              if (0x4b < node->length) {
                                bf_put_int32_be(bfile,*(int32_t *)(buffer + 0x44));
                                uVar1 = (uint)node->length;
                                uVar2 = 0x4c;
                                if (0x4f < node->length) {
                                  bf_put_int32_be(bfile,*(int32_t *)(buffer + 0x48));
                                  uVar1 = (uint)node->length;
                                  uVar2 = 0x50;
                                  if (0x53 < node->length) {
                                    bf_put_int32_be(bfile,*(int32_t *)(buffer + 0x4c));
                                    uVar1 = (uint)node->length;
                                    uVar2 = 0x54;
                                    if (0x57 < node->length) {
                                      bf_put_int32_be(bfile,*(int32_t *)(buffer + 0x50));
                                      uVar1 = (uint)node->length;
                                      uVar2 = 0x58;
                                      if (0x5b < node->length) {
                                        bf_put_int32_be(bfile,*(int32_t *)(buffer + 0x54));
                                        uVar1 = (uint)node->length;
                                        uVar2 = 0x5c;
                                        if (0x5f < node->length) {
                                          bf_put_int32_be(bfile,*(int32_t *)(buffer + 0x58));
                                          uVar1 = (uint)node->length;
                                          uVar2 = 0x60;
                                          if (99 < node->length) {
                                            bf_put_int32_be(bfile,*(int32_t *)(buffer + 0x5c));
                                            uVar1 = (uint)node->length;
                                            uVar2 = 100;
                                            if (0x67 < node->length) {
                                              bf_put_int32_be(bfile,*(int32_t *)(buffer + 0x60));
                                              uVar1 = (uint)node->length;
                                              uVar2 = 0x68;
                                              if (0x6b < node->length) {
                                                bf_put_int32_be(bfile,*(int32_t *)(buffer + 100));
                                                uVar1 = (uint)node->length;
                                                uVar2 = 0x6c;
                                                if (0x6f < node->length) {
                                                  bf_put_int32_be(bfile,*(int32_t *)(buffer + 0x68))
                                                  ;
                                                  uVar1 = (uint)node->length;
                                                  uVar2 = 0x70;
                                                  if (0x73 < node->length) {
                                                    bf_put_int32_be(bfile,*(int32_t *)
                                                                           (buffer + 0x6c));
                                                    uVar1 = (uint)node->length;
                                                    uVar2 = 0x74;
                                                    if (0x77 < node->length) {
                                                      bf_put_int32_be(bfile,*(int32_t *)
                                                                             (buffer + 0x70));
                                                      uVar1 = (uint)node->length;
                                                      uVar2 = 0x78;
                                                      if (0x7b < node->length) {
                                                        bf_put_int32_be(bfile,*(int32_t *)
                                                                               (buffer + 0x74));
                                                        uVar1 = (uint)node->length;
                                                        uVar2 = 0x7c;
                                                        if (0x7d < node->length) {
                                                          bf_put_int16_be(bfile,*(int16_t *)
                                                                                 (buffer + 0x78));
                                                          uVar1 = (uint)node->length;
                                                          if (node->length < 0x80) {
                                                            uVar2 = 0x7e;
                                                          }
                                                          else {
                                                            bf_put_int16_be(bfile,*(int16_t *)
                                                                                   (buffer + 0x7a));
                                                            uVar1 = (uint)node->length;
                                                            if (node->length < 0x84) {
                                                              uVar2 = 0x80;
                                                            }
                                                            else {
                                                              bf_put_int32_be(bfile,*(int32_t *)
                                                                                     (buffer + 0x7c)
                                                                             );
                                                              uVar1 = (uint)node->length;
                                                              if (node->length < 0x8c) {
                                                                uVar2 = 0x84;
                                                              }
                                                              else {
                                                                bf_put_float64_be(bfile,*(float64_t 
                                                  *)(buffer + 0x80));
                                                  uVar1 = (uint)node->length;
                                                  if (node->length < 0x94) {
                                                    uVar2 = 0x8c;
                                                  }
                                                  else {
                                                    bf_put_float64_be(bfile,*(float64_t *)
                                                                             (buffer + 0x88));
                                                    uVar1 = (uint)node->length;
                                                    if (node->length < 0x9c) {
                                                      uVar2 = 0x94;
                                                    }
                                                    else {
                                                      bf_put_float64_be(bfile,*(float64_t *)
                                                                               (buffer + 0x90));
                                                      uVar1 = (uint)node->length;
                                                      if (node->length < 0xa4) {
                                                        uVar2 = 0x9c;
                                                      }
                                                      else {
                                                        bf_put_float64_be(bfile,*(float64_t *)
                                                                                 (buffer + 0x98));
                                                        uVar1 = (uint)node->length;
                                                        if (node->length < 0xa6) {
                                                          uVar2 = 0xa4;
                                                        }
                                                        else {
                                                          bf_put_int16_be(bfile,*(int16_t *)
                                                                                 (buffer + 0xa0));
                                                          uVar1 = (uint)node->length;
                                                          if (node->length < 0xa8) {
                                                            uVar2 = 0xa6;
                                                          }
                                                          else {
                                                            bf_put_int16_be(bfile,*(int16_t *)
                                                                                   (buffer + 0xa2));
                                                            uVar1 = (uint)node->length;
                                                            if (node->length < 0xac) {
                                                              uVar2 = 0xa8;
                                                            }
                                                            else {
                                                              bf_put_int32_be(bfile,*(int32_t *)
                                                                                     (buffer + 0xa4)
                                                                             );
                                                              uVar1 = (uint)node->length;
                                                              if (node->length < 0xb0) {
                                                                uVar2 = 0xac;
                                                              }
                                                              else {
                                                                bf_put_int32_be(bfile,*(int32_t *)
                                                                                       (buffer + 
                                                  0xa8));
                                                  uVar1 = (uint)node->length;
                                                  if (node->length < 0xb2) {
                                                    uVar2 = 0xb0;
                                                  }
                                                  else {
                                                    bf_put_int16_be(bfile,*(int16_t *)
                                                                           (buffer + 0xac));
                                                    uVar1 = (uint)node->length;
                                                    if (node->length < 0xb4) {
                                                      uVar2 = 0xb2;
                                                    }
                                                    else {
                                                      bf_put_int16_be(bfile,*(int16_t *)
                                                                             (buffer + 0xae));
                                                      uVar1 = (uint)node->length;
                                                      if (node->length < 0xb6) {
                                                        uVar2 = 0xb4;
                                                      }
                                                      else {
                                                        bf_put_int16_be(bfile,*(int16_t *)
                                                                               (buffer + 0xb0));
                                                        uVar1 = (uint)node->length;
                                                        if (node->length < 0xb8) {
                                                          uVar2 = 0xb6;
                                                        }
                                                        else {
                                                          bf_put_int16_be(bfile,*(int16_t *)
                                                                                 (buffer + 0xb2));
                                                          uVar1 = (uint)node->length;
                                                          if (node->length < 0xbc) {
                                                            uVar2 = 0xb8;
                                                          }
                                                          else {
                                                            bf_put_int32_be(bfile,*(int32_t *)
                                                                                   (buffer + 0xb4));
                                                            uVar1 = (uint)node->length;
                                                            if (node->length < 0xc4) {
                                                              uVar2 = 0xbc;
                                                            }
                                                            else {
                                                              bf_put_float64_be(bfile,*(float64_t *)
                                                                                       (buffer + 
                                                  0xb8));
                                                  uVar1 = (uint)node->length;
                                                  if (node->length < 0xcc) {
                                                    uVar2 = 0xc4;
                                                  }
                                                  else {
                                                    bf_put_float64_be(bfile,*(float64_t *)
                                                                             (buffer + 0xc0));
                                                    uVar1 = (uint)node->length;
                                                    if (node->length < 0xd4) {
                                                      uVar2 = 0xcc;
                                                    }
                                                    else {
                                                      bf_put_float64_be(bfile,*(float64_t *)
                                                                               (buffer + 200));
                                                      uVar1 = (uint)node->length;
                                                      if (node->length < 0xdc) {
                                                        uVar2 = 0xd4;
                                                      }
                                                      else {
                                                        bf_put_float64_be(bfile,*(float64_t *)
                                                                                 (buffer + 0xd0));
                                                        uVar1 = (uint)node->length;
                                                        if (node->length < 0xe4) {
                                                          uVar2 = 0xdc;
                                                        }
                                                        else {
                                                          bf_put_float64_be(bfile,*(float64_t *)
                                                                                   (buffer + 0xd8));
                                                          uVar1 = (uint)node->length;
                                                          if (node->length < 0xec) {
                                                            uVar2 = 0xe4;
                                                          }
                                                          else {
                                                            bf_put_float64_be(bfile,*(float64_t *)
                                                                                     (buffer + 0xe0)
                                                                             );
                                                            uVar1 = (uint)node->length;
                                                            if (node->length < 0xf4) {
                                                              uVar2 = 0xec;
                                                            }
                                                            else {
                                                              bf_put_float64_be(bfile,*(float64_t *)
                                                                                       (buffer + 
                                                  0xe8));
                                                  uVar1 = (uint)node->length;
                                                  if (node->length < 0xfc) {
                                                    uVar2 = 0xf4;
                                                  }
                                                  else {
                                                    bf_put_float64_be(bfile,*(float64_t *)
                                                                             (buffer + 0xf0));
                                                    uVar1 = (uint)node->length;
                                                    if (node->length < 0xfe) {
                                                      uVar2 = 0xfc;
                                                    }
                                                    else {
                                                      bf_put_int16_be(bfile,*(int16_t *)
                                                                             (buffer + 0xf8));
                                                      uVar1 = (uint)node->length;
                                                      if (node->length < 0x100) {
                                                        uVar2 = 0xfe;
                                                      }
                                                      else {
                                                        bf_put_int16_be(bfile,*(int16_t *)
                                                                               (buffer + 0xfa));
                                                        uVar1 = (uint)node->length;
                                                        if (node->length < 0x102) {
                                                          uVar2 = 0x100;
                                                        }
                                                        else {
                                                          bf_put_int16_be(bfile,*(int16_t *)
                                                                                 (buffer + 0xfc));
                                                          uVar1 = (uint)node->length;
                                                          if (node->length < 0x104) {
                                                            uVar2 = 0x102;
                                                          }
                                                          else {
                                                            bf_put_int16_be(bfile,*(int16_t *)
                                                                                   (buffer + 0xfe));
                                                            uVar1 = (uint)node->length;
                                                            if (node->length < 0x106) {
                                                              uVar2 = 0x104;
                                                            }
                                                            else {
                                                              bf_put_int16_be(bfile,*(int16_t *)
                                                                                     (buffer + 0x100
                                                                                     ));
                                                              uVar1 = (uint)node->length;
                                                              if (node->length < 0x108) {
                                                                uVar2 = 0x106;
                                                              }
                                                              else {
                                                                bf_put_int16_be(bfile,*(int16_t *)
                                                                                       (buffer + 
                                                  0x102));
                                                  uVar1 = (uint)node->length;
                                                  if (node->length < 0x10a) {
                                                    uVar2 = 0x108;
                                                  }
                                                  else {
                                                    bf_put_int16_be(bfile,*(int16_t *)
                                                                           (buffer + 0x104));
                                                    uVar1 = (uint)node->length;
                                                    if (node->length < 0x10c) {
                                                      uVar2 = 0x10a;
                                                    }
                                                    else {
                                                      bf_put_int16_be(bfile,*(int16_t *)
                                                                             (buffer + 0x106));
                                                      uVar1 = (uint)node->length;
                                                      if (node->length < 0x110) {
                                                        uVar2 = 0x10c;
                                                      }
                                                      else {
                                                        bf_put_int32_be(bfile,*(int32_t *)
                                                                               (buffer + 0x108));
                                                        uVar1 = (uint)node->length;
                                                        if (node->length < 0x112) {
                                                          uVar2 = 0x110;
                                                        }
                                                        else {
                                                          bf_put_int16_be(bfile,*(int16_t *)
                                                                                 (buffer + 0x10c));
                                                          uVar1 = (uint)node->length;
                                                          if (node->length < 0x114) {
                                                            uVar2 = 0x112;
                                                          }
                                                          else {
                                                            bf_put_int16_be(bfile,*(int16_t *)
                                                                                   (buffer + 0x10e))
                                                            ;
                                                            uVar1 = (uint)node->length;
                                                            if (node->length < 0x116) {
                                                              uVar2 = 0x114;
                                                            }
                                                            else {
                                                              bf_put_int16_be(bfile,*(int16_t *)
                                                                                     (buffer + 0x110
                                                                                     ));
                                                              uVar1 = (uint)node->length;
                                                              uVar2 = 0x116;
                                                            }
                                                          }
                                                        }
                                                      }
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    bVar3 = 1;
    if (uVar2 <= uVar1 && uVar1 - uVar2 != 0) {
      bf_write(bfile,node->data + (ulong)uVar2 + 2,uVar1 - uVar2);
    }
  }
  else {
    bVar3 = 0;
    prf_error(9,"tried header save method on node of type %d.");
  }
  return bVar3;
}

Assistant:

static
bool_t
prf_header_save_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int pos;
    assert( node != NULL && state != NULL && bfile != NULL );

    if ( node->opcode != prf_header_info.opcode ) {
        prf_error( 9, "tried header save method on node of type %d.",
            node->opcode );
        return FALSE;
    }

    bf_put_uint16_be( bfile, node->opcode );
    bf_put_uint16_be( bfile, node->length );

    pos = 4;
    do {
        node_data * data;
        data = (node_data *) node->data;
        if ( node->length < (pos + 8) ) break;
        bf_write( bfile, (uint8_t *) data->id, 8 ); pos += 8;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->format_revision_level ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->edit_revision_level ); pos += 4;
        if ( node->length < (pos + 32) ) break;
        bf_write( bfile, (uint8_t *) data->date_and_time, 32 ); pos += 32;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->next_group ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->next_lod ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->next_object ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->next_face ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->unit_multiplier_divisor ); pos += 2;
        if ( node->length < (pos + 1) ) break;
        bf_put_int8( bfile, data->vertex_coordinate_units ); pos += 1;
        if ( node->length < (pos + 1) ) break;
        bf_put_int8( bfile, data->texwhite ); pos += 1;
        if ( node->length < (pos + 4) ) break;
        bf_put_uint32_be( bfile, data->flags ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->reserved1[0] ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->reserved1[1] ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->reserved1[2] ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->reserved1[3] ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->reserved1[4] ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->reserved1[5] ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->projection_type ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->reserved2[0] ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->reserved2[1] ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->reserved2[2] ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->reserved2[3] ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->reserved2[4] ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->reserved2[5] ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->reserved2[6] ); pos += 4;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->next_dof ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->vertex_storage_type ); pos += 2;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->database_origin ); pos += 4;
        if ( node->length < (pos + 8) ) break;
        bf_put_float64_be( bfile, prf_dblread( data->southwest_database_x ) );
            pos += 8;
        if ( node->length < (pos + 8) ) break;
        bf_put_float64_be( bfile, prf_dblread( data->southwest_database_y ) );
            pos += 8;
        if ( node->length < (pos + 8) ) break;
        bf_put_float64_be( bfile, prf_dblread( data->delta_x ) ); pos += 8;
        if ( node->length < (pos + 8) ) break;
        bf_put_float64_be( bfile, prf_dblread( data->delta_y ) ); pos += 8;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->next_sound ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->next_path ); pos += 2;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->reserved3[0] ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->reserved3[1] ); pos += 4;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->next_clip ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->next_text ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->next_bsp ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->next_switch ); pos += 2;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->reserved4 ); pos += 4;
        if ( node->length < (pos + 8) ) break;
        bf_put_float64_be( bfile, prf_dblread( data->southwest_corner_latitude ) );
            pos += 8;
        if ( node->length < (pos + 8) ) break;
        bf_put_float64_be( bfile, prf_dblread( data->southwest_corner_longitude ) );
            pos += 8;
        if ( node->length < (pos + 8) ) break;
        bf_put_float64_be( bfile, prf_dblread( data->northeast_corner_latitude ) );
            pos += 8;
        if ( node->length < (pos + 8) ) break;
        bf_put_float64_be( bfile, prf_dblread( data->northeast_corner_longitude ) );
            pos += 8;
        if ( node->length < (pos + 8) ) break;
        bf_put_float64_be( bfile, prf_dblread( data->origin_latitude ) );
            pos += 8;
        if ( node->length < (pos + 8) ) break;
        bf_put_float64_be( bfile, prf_dblread( data->origin_longitude ) );
            pos += 8;
        if ( node->length < (pos + 8) ) break;
        bf_put_float64_be( bfile, prf_dblread( data->lambert_upper_latitude ) );
            pos += 8;
        if ( node->length < (pos + 8) ) break;
        bf_put_float64_be( bfile, prf_dblread( data->lambert_lower_latitude ) );
            pos += 8;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->next_light_source ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->next_light_point ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->next_road ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->next_cat ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->reserved5 ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->reserved6 ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->reserved7 ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->reserved8 ); pos += 2;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->earth_ellipsoid_model ); pos += 4;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->next_adaptive ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->next_curve ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->reserved9 ); pos += 2;
    } while ( FALSE );

    if ( pos < node->length )
        pos += bf_write( bfile, node->data + pos - 4 + NODE_DATA_PAD,
            node->length - pos );

    return TRUE;
}